

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain_tests.cpp
# Opt level: O0

void blockchain_tests::get_difficulty_for_very_low_target_invoker(void)

{
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long in_FS_OFFSET;
  get_difficulty_for_very_low_target t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1c8;
  std_string *in_stack_fffffffffffff1d0;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1d8;
  get_difficulty_for_very_low_target *in_stack_fffffffffffff1e8;
  const_string *in_stack_fffffffffffff1f0;
  size_t in_stack_fffffffffffff1f8;
  const_string *in_stack_fffffffffffff200;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff208;
  unit_test_log_t *this_00;
  const_string local_c38 [25];
  undefined1 local_aa0 [408];
  undefined1 local_908 [408];
  undefined1 local_770 [1488];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [35])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [15])in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  get_difficulty_for_very_low_target::get_difficulty_for_very_low_target(in_stack_fffffffffffff1e8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  memset(local_770,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [35])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [16])in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::unit_test::setup_conditional<blockchain_tests::get_difficulty_for_very_low_target>
            ((get_difficulty_for_very_low_target *)0x4271be);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  memset(local_908,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [35])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [13])in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  get_difficulty_for_very_low_target::test_method
            ((get_difficulty_for_very_low_target *)in_stack_fffffffffffff1c8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  memset(local_aa0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [35])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [19])in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::unit_test::teardown_conditional<blockchain_tests::get_difficulty_for_very_low_target>
            ((get_difficulty_for_very_low_target *)0x42740e);
  this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  file = local_c38;
  memset(file,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  line_num = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  msg = boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [35])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [15])in_stack_fffffffffffff1d0);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (this_00,file,(size_t)line_num,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  get_difficulty_for_very_low_target::~get_difficulty_for_very_low_target
            ((get_difficulty_for_very_low_target *)in_stack_fffffffffffff1c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(get_difficulty_for_very_low_target)
{
    TestDifficulty(0x1f111111, 0.000001);
}